

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v1.cpp
# Opt level: O0

void __thiscall intel_keym_v1_t::signature_t::~signature_t(signature_t *this)

{
  signature_t *this_local;
  
  ~signature_t(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

intel_keym_v1_t::signature_t::~signature_t() {
    _clean_up();
}